

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcm2wav.cc
# Opt level: O3

void __thiscall ConvertorPCM2WAV::write_chunk(ConvertorPCM2WAV *this,string *name,PBuffer *data)

{
  MutableBuffer *this_00;
  PBuffer local_20;
  
  MutableBuffer::push((this->result).super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,name);
  MutableBuffer::push<unsigned_int>
            ((this->result).super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (uint)((data->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->size,1);
  this_00 = (this->result).super___shared_ptr<MutableBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_20.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (data->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_20.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (data->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_20.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_20.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_20.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_20.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_20.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
    }
  }
  MutableBuffer::push(this_00,&local_20);
  if (local_20.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return;
}

Assistant:

void
ConvertorPCM2WAV::write_chunk(const std::string &name, PBuffer data) {
  result->push(name);
  result->push<uint32_t>(static_cast<uint32_t>(data->get_size()));
  result->push(data);
}